

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_extended_msg(raft_server *this,req_msg *req)

{
  long *plVar1;
  element_type *peVar2;
  char *__s;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ptr<resp_msg> pVar4;
  allocator<char> local_a9;
  string local_a8 [32];
  strfmt<100> local_88;
  
  switch(*(uint *)(in_RDX + 0x10)) {
  case 6:
    pVar4 = handle_add_srv_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  default:
    plVar1 = (long *)req[4].last_log_term_;
    local_88.fmt_ = "receive an unknown request %s, for safety, step down.";
    __s = strfmt<100>::fmt<char_const*>(&local_88,__msg_type_str[*(uint *)(in_RDX + 0x10)]);
    std::__cxx11::string::string<std::allocator<char>>(local_a8,__s,&local_a9);
    (**(code **)(*plVar1 + 0x28))(plVar1,local_a8);
    std::__cxx11::string::~string(local_a8);
    peVar2 = (((req->log_entries_).
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(code **)(peVar2->term_ + 0x40))(peVar2,0xffffffff);
    exit(-1);
  case 8:
    pVar4 = handle_rm_srv_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 10:
    pVar4 = handle_log_sync_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0xc:
    pVar4 = handle_join_cluster_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0xe:
    pVar4 = handle_leave_cluster_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0x10:
    pVar4 = handle_install_snapshot_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0x12:
    pVar4 = handle_prevote_req(this,req);
    _Var3 = pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_extended_msg(req_msg& req)
{
    switch (req.get_type())
    {
        case msg_type::add_server_request:
            return handle_add_srv_req(req);
        case msg_type::remove_server_request:
            return handle_rm_srv_req(req);
        case msg_type::sync_log_request:
            return handle_log_sync_req(req);
        case msg_type::join_cluster_request:
            return handle_join_cluster_req(req);
        case msg_type::leave_cluster_request:
            return handle_leave_cluster_req(req);
        case msg_type::install_snapshot_request:
            return handle_install_snapshot_req(req);
        case msg_type::prevote_request:
            return handle_prevote_req(req);
        default:
            l_->err(
                sstrfmt("receive an unknown request %s, for safety, step down.").fmt(__msg_type_str[req.get_type()]));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            break;
    }

    return ptr<resp_msg>();
}